

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction::~IfcStructuralPlanarAction
          (IfcStructuralPlanarAction *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x896888;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x8969a0;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x8968b0;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x8968d8;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       (pointer)0x896900;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x896928;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x896950;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x896978;
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x896b50;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x896c40;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x896b78;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x896ba0;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       (pointer)0x896bc8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x896bf0;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x896c18;
  if (*(undefined1 **)&this[-1].field_0x190 != &this[-1].field_0x1a0) {
    operator_delete(*(undefined1 **)&this[-1].field_0x190,*(long *)&this[-1].field_0x1a0 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)puVar1,&PTR_construction_vtable_24__008969c0);
  operator_delete(puVar1,0x1c0);
  return;
}

Assistant:

IfcStructuralPlanarAction() : Object("IfcStructuralPlanarAction") {}